

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>::
convertTo<QString>(QString *__return_storage_ptr__,
                  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
                  *this)

{
  QLatin1String *pQVar1;
  QChar *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  QString *pQVar6;
  char16_t *__src;
  char16_t *pcVar7;
  
  lVar3 = (this->a).a.a.d.size;
  lVar4 = (((this->a).b)->d).size;
  lVar5 = (this->a).a.b.m_size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar4 + lVar3 + lVar5 + 1,Uninitialized);
  pcVar7 = (__return_storage_ptr__->d).ptr;
  lVar3 = (this->a).a.a.d.size;
  if (lVar3 != 0) {
    __src = (this->a).a.a.d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar7,__src,lVar3 * 2);
  }
  pQVar2 = (QChar *)(pcVar7 + lVar3);
  pQVar1 = &(this->a).a.b;
  lVar3 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar2);
  pQVar6 = (this->a).b;
  lVar4 = (pQVar6->d).size;
  if (lVar4 != 0) {
    pcVar7 = (pQVar6->d).ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar2 + lVar3,pcVar7,lVar4 * 2);
  }
  (pQVar2 + lVar3)[lVar4].ucs = this->b;
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }